

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::Texture3DSpecCase::verifyTexture
          (Texture3DSpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  TestLog *log;
  deUint32 program;
  Surface *dst;
  _Alloc_hider imageSetDesc;
  _Alloc_hider imageSetName;
  bool bVar1;
  DataType samplerType;
  RenderTarget *pRVar2;
  byte bVar3;
  ReferenceContext *context;
  int iVar4;
  int iVar5;
  int local_320;
  int local_31c;
  allocator<char> local_315;
  uint local_314;
  ReferenceContext *local_310;
  float local_304;
  int local_300;
  deUint32 local_2fc;
  deUint32 local_2f8;
  int local_2f4;
  ReferenceContext *local_2f0;
  ContextWrapper *local_2e8;
  Surface result;
  Surface reference;
  string desc;
  string sliceStr;
  string levelStr;
  ConstPixelBufferAccess local_250;
  ConstPixelBufferAccess local_228;
  string name;
  UVec4 threshold;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  Texture3DShader shader;
  
  samplerType = glu::getSampler3DType(this->m_texFormat);
  FboTestUtil::Texture3DShader::Texture3DShader(&shader,samplerType,TYPE_FLOAT_VEC4);
  local_2f0 = (ReferenceContext *)gles3Context;
  local_2f8 = (*(gles3Context->super_Context)._vptr_Context[0x75])(gles3Context,&shader);
  local_2fc = (*(refContext->super_Context)._vptr_Context[0x75])(refContext,&shader);
  FboTestUtil::Texture3DShader::setTexScaleBias
            (&shader,&(this->m_texFormatInfo).lookupScale,&(this->m_texFormatInfo).lookupBias);
  local_2e8 = &(this->super_TextureSpecCase).super_ContextWrapper;
  iVar5 = 2;
  while (iVar5 != 0) {
    context = refContext;
    if (iVar5 == 2) {
      context = local_2f0;
    }
    sglr::ContextWrapper::setContext(local_2e8,&context->super_Context);
    sglr::ContextWrapper::glTexParameteri(local_2e8,0x806f,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri(local_2e8,0x806f,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri(local_2e8,0x806f,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_2e8,0x806f,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_2e8,0x806f,0x8072,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_2e8,0x806f,0x813d,this->m_numLevels + -1);
    iVar5 = iVar5 + -1;
  }
  local_310 = refContext;
  for (local_31c = 0; local_31c < this->m_numLevels; local_31c = local_31c + 1) {
    bVar3 = (byte)local_31c;
    local_2f4 = this->m_width >> (bVar3 & 0x1f);
    if (local_2f4 < 2) {
      local_2f4 = 1;
    }
    iVar5 = this->m_height >> (bVar3 & 0x1f);
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    local_300 = this->m_depth >> (bVar3 & 0x1f);
    if (local_300 < 2) {
      local_300 = 1;
    }
    local_304 = (float)local_300;
    local_314 = 1;
    for (local_320 = 0; local_320 < local_300; local_320 = local_320 + 1) {
      tcu::Surface::Surface(&reference);
      tcu::Surface::Surface(&result);
      FboTestUtil::Texture3DShader::setDepth(&shader,((float)local_320 + 0.5) / local_304);
      iVar4 = 2;
      while (iVar4 != 0) {
        program = local_2fc;
        dst = &reference;
        if (iVar4 == 2) {
          program = local_2f8;
          dst = &result;
          refContext = local_2f0;
        }
        sglr::ContextWrapper::setContext(local_2e8,&refContext->super_Context);
        FboTestUtil::Texture3DShader::setUniforms(&shader,&refContext->super_Context,program);
        TextureSpecCase::renderTex(&this->super_TextureSpecCase,dst,program,local_2f4,iVar5);
        refContext = local_310;
        iVar4 = iVar4 + -1;
      }
      pRVar2 = Context::getRenderTarget((this->super_TextureSpecCase).super_TestCase.m_context);
      computeCompareThreshold((Functional *)&threshold,&pRVar2->m_pixelFormat,this->m_texFormat);
      de::toString<int>(&levelStr,&local_31c);
      de::toString<int>(&sliceStr,&local_320);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&desc,"Level",(allocator<char> *)&local_1d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228
                     ,&desc,&levelStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_228,"Slice");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_250,&sliceStr);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Level ",&local_315);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228
                     ,&local_1d0,&levelStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_228,", Slice ");
      std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_250,&sliceStr);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1d0);
      imageSetName = name._M_dataplus;
      imageSetDesc = desc._M_dataplus;
      log = ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
            m_log;
      tcu::Surface::getAccess((PixelBufferAccess *)&local_250,&reference);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_228,&result);
      bVar1 = tcu::intThresholdCompare
                        (log,imageSetName._M_p,imageSetDesc._M_p,&local_250,&local_228,&threshold,
                         (local_320 != 0 || local_31c != 0) + COMPARE_LOG_RESULT);
      if (!bVar1) {
        tcu::TestContext::setTestResult
                  ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
        local_314 = 0;
      }
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&sliceStr);
      std::__cxx11::string::~string((string *)&levelStr);
      tcu::Surface::~Surface(&result);
      tcu::Surface::~Surface(&reference);
      refContext = local_310;
      if (!bVar1) break;
    }
    if ((local_314 & 1) == 0) break;
  }
  sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
  return;
}

Assistant:

void Texture3DSpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture3DShader shader			(glu::getSampler3DType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32		shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32		shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
	{
		int		levelW		= de::max(1, m_width	>> levelNdx);
		int		levelH		= de::max(1, m_height	>> levelNdx);
		int		levelD		= de::max(1, m_depth	>> levelNdx);
		bool	levelOk		= true;

		for (int depth = 0; depth < levelD; depth++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			shader.setDepth(((float)depth + 0.5f) / (float)levelD);

			for (int ndx = 0; ndx < 2; ndx++)
			{
				tcu::Surface&	dst			= ndx ? reference									: result;
				sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
				deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

				setContext(ctx);
				shader.setUniforms(*ctx, shaderID);
				renderTex(dst, shaderID, levelW, levelH);
			}

			UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			string			levelStr	= de::toString(levelNdx);
			string			sliceStr	= de::toString(depth);
			string			name		= string("Level") + levelStr + "Slice" + sliceStr;
			string			desc		= string("Level ") + levelStr + ", Slice " + sliceStr;
			bool			depthOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
																   (levelNdx == 0 && depth == 0) ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!depthOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				levelOk = false;
				break;
			}
		}

		if (!levelOk)
			break;
	}
}